

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>
          (rule *this,not_null<pstore::transaction_base_*> args,
          not_null<const_pstore::exchange::import_ns::string_mapping_*> args_1,uint128 *args_2)

{
  context *pcVar1;
  error_code eVar2;
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_>_>
  local_48;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_40;
  uint128 *local_38;
  uint128 *args_local_2;
  rule *this_local;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args_local_1;
  not_null<pstore::transaction_base_*> args_local;
  error_category *local_10;
  
  local_38 = args_2;
  args_local_2 = (uint128 *)this;
  this_local = (rule *)args_1.ptr_;
  args_local_1.ptr_ = (string_mapping *)args.ptr_;
  pcVar1 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->(&this->context_);
  std::
  make_unique<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::gsl::not_null<pstore::transaction_base*>&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>&,pstore::uint128*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_48,
             (not_null<pstore::transaction_base_*> *)&this->context_,&args_local_1,
             (uint128 **)&this_local);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_40,&local_48);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(&pcVar1->stack,(value_type *)&local_40);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_40);
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_>_>
  ::~unique_ptr(&local_48);
  log_top(this,true);
  std::error_code::error_code((error_code *)&args_local);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)args_local.ptr_;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }